

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

BOOL Js::JavascriptOperators::PropertyReferenceWalk_Impl<false>
               (Var instance,RecyclableObject **propertyObject,PropertyId propertyId,Var *value,
               PropertyValueInfo *info,ScriptContext *requestContext)

{
  Type *pTVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  RecyclableObject *this;
  uint uVar7;
  undefined4 extraout_var;
  
  this = *propertyObject;
  uVar7 = 0;
  if (((this->type).ptr)->typeId != TypeIds_Null) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      iVar4 = (*(this->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x16])
                        (this,instance,(ulong)(uint)propertyId,value,info,requestContext);
      if (iVar4 != 0) {
        uVar7 = (uint)(iVar4 == 1);
        goto LAB_00ac26c1;
      }
      BVar5 = RecyclableObject::SkipsPrototype(this);
      if (BVar5 != 0) break;
      pTVar1 = (this->type).ptr;
      if ((pTVar1->flags & TypeFlagMask_HasSpecialPrototype) == TypeFlagMask_None) {
LAB_00ac2689:
        this = (pTVar1->prototype).ptr;
      }
      else if (pTVar1->typeId == TypeIds_Proxy) {
        this = (pTVar1->prototype).ptr;
        if (this != (((((((pTVar1->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                        scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary)->
                    super_JavascriptLibraryBase).nullValue.ptr) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x57a,
                                      "(type->GetPrototype() == instance->GetScriptContext()->GetLibrary()->GetNull())"
                                      ,
                                      "type->GetPrototype() == instance->GetScriptContext()->GetLibrary()->GetNull()"
                                     );
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar6 = 0;
          goto LAB_00ac2689;
        }
      }
      else {
        iVar4 = (*(this->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[6])(this);
        this = (RecyclableObject *)CONCAT44(extraout_var,iVar4);
      }
    } while (((this->type).ptr)->typeId != TypeIds_Null);
    uVar7 = 0;
  }
LAB_00ac26c1:
  *propertyObject = this;
  return uVar7;
}

Assistant:

BOOL JavascriptOperators::PropertyReferenceWalk_Impl(Var instance, RecyclableObject** propertyObject, PropertyId propertyId, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        BOOL foundProperty = false;
        RecyclableObject* object = *propertyObject;
        while (!foundProperty && !JavascriptOperators::IsNull(object))
        {
            if (unscopables && JavascriptOperators::IsPropertyUnscopable(object, propertyId))
            {
                break;
            }
            else
            {
                PropertyQueryFlags result = object->GetPropertyReferenceQuery(instance, propertyId, value, info, requestContext);
                if (result != PropertyQueryFlags::Property_NotFound)
                {
                    foundProperty = JavascriptConversion::PropertyQueryFlagsToBoolean(result);
                    break;
                }
            }

            if (object->SkipsPrototype())
            {
                break; // will return false
            }

            object = JavascriptOperators::GetPrototypeNoTrap(object);

        }
        *propertyObject = object;
        return foundProperty;
    }